

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * skip_quoted(char **buf,char *delimiters,char *whitespace,char quotechar)

{
  char *__s;
  size_t sVar1;
  size_t end_off;
  char *end_whitespace;
  char *end_word;
  char *begin_word;
  char *p;
  char quotechar_local;
  char *whitespace_local;
  char *delimiters_local;
  char **buf_local;
  
  __s = *buf;
  sVar1 = strcspn(__s,delimiters);
  end_whitespace = __s + sVar1;
  if (__s < end_whitespace) {
    for (begin_word = end_whitespace + -1; *begin_word == quotechar; begin_word = begin_word + sVar1
        ) {
      if (*end_whitespace == '\0') {
        *begin_word = '\0';
        break;
      }
      sVar1 = strcspn(end_whitespace + 1,delimiters);
      memmove(begin_word,end_whitespace,sVar1 + 1);
      end_whitespace = end_whitespace + sVar1 + 1;
    }
    while (begin_word = begin_word + 1, begin_word < end_whitespace) {
      *begin_word = '\0';
    }
  }
  if (*end_whitespace == '\0') {
    *buf = end_whitespace;
  }
  else {
    sVar1 = strspn(end_whitespace + 1,whitespace);
    for (begin_word = end_whitespace; begin_word < end_whitespace + sVar1 + 1;
        begin_word = begin_word + 1) {
      *begin_word = '\0';
    }
    *buf = end_whitespace + sVar1 + 1;
  }
  return __s;
}

Assistant:

static char *
skip_quoted(char **buf,
            const char *delimiters,
            const char *whitespace,
            char quotechar)
{
	char *p, *begin_word, *end_word, *end_whitespace;

	begin_word = *buf;
	end_word = begin_word + strcspn(begin_word, delimiters);

	/* Check for quotechar */
	if (end_word > begin_word) {
		p = end_word - 1;
		while (*p == quotechar) {
			/* While the delimiter is quoted, look for the next delimiter. */
			/* This happens, e.g., in calls from parse_auth_header,
			 * if the user name contains a " character. */

			/* If there is anything beyond end_word, copy it. */
			if (*end_word != '\0') {
				size_t end_off = strcspn(end_word + 1, delimiters);
				memmove(p, end_word, end_off + 1);
				p += end_off; /* p must correspond to end_word - 1 */
				end_word += end_off + 1;
			} else {
				*p = '\0';
				break;
			}
		}
		for (p++; p < end_word; p++) {
			*p = '\0';
		}
	}

	if (*end_word == '\0') {
		*buf = end_word;
	} else {

#if defined(GCC_DIAGNOSTIC)
		/* Disable spurious conversion warning for GCC */
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif /* defined(GCC_DIAGNOSTIC) */

		end_whitespace = end_word + strspn(&end_word[1], whitespace) + 1;

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif /* defined(GCC_DIAGNOSTIC) */

		for (p = end_word; p < end_whitespace; p++) {
			*p = '\0';
		}

		*buf = end_whitespace;
	}

	return begin_word;
}